

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool __thiscall VmBlock::HasExternalInstructionUsers(VmBlock *this)

{
  bool bVar1;
  VmInstruction *pVVar2;
  ulong uVar3;
  ulong uVar4;
  VmValue *pVVar5;
  bool bVar6;
  bool bVar7;
  
  pVVar2 = this->firstInstruction;
  do {
    bVar1 = pVVar2 != (VmInstruction *)0x0;
    if (pVVar2 == (VmInstruction *)0x0) {
      return bVar1;
    }
    uVar3 = (ulong)(pVVar2->super_VmValue).users.count;
    bVar6 = uVar3 != 0;
    if (bVar6) {
      uVar4 = 1;
      do {
        pVVar5 = (pVVar2->super_VmValue).users.data[uVar4 - 1];
        if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 2)) {
          pVVar5 = (VmValue *)0x0;
        }
        if ((pVVar5 != (VmValue *)0x0) && ((VmBlock *)pVVar5[1].users.data != this)) {
          if (bVar6) {
            return bVar1;
          }
          break;
        }
        bVar6 = uVar4 < uVar3;
        bVar7 = uVar4 != uVar3;
        uVar4 = uVar4 + 1;
      } while (bVar7);
    }
    pVVar2 = pVVar2->nextSibling;
  } while( true );
}

Assistant:

bool VmBlock::HasExternalInstructionUsers()
{
	for(VmInstruction *curr = firstInstruction; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(VmInstruction *instUser = getType<VmInstruction>(curr->users[i]))
			{
				if(instUser->parent != this)
					return true;
			}
		}
	}

	return false;
}